

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblemenu.cpp
# Opt level: O1

QAccessibleInterface * __thiscall QAccessibleMenu::childAt(QAccessibleMenu *this,int x,int y)

{
  char cVar1;
  QMenu *this_00;
  QWidget *pQVar2;
  QAction *pQVar3;
  QAccessibleInterface *pQVar4;
  QAction *action;
  long in_FS_OFFSET;
  QPoint local_40;
  QPoint local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))();
  this_00 = (QMenu *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
  pQVar2 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
  local_40.xp.m_i = x;
  local_40.yp.m_i = y;
  local_38 = QWidget::mapFromGlobal(pQVar2,&local_40);
  pQVar3 = QMenu::actionAt(this_00,&local_38);
  if (pQVar3 == (QAction *)0x0) {
    action = (QAction *)0x0;
  }
  else {
    cVar1 = QAction::isSeparator();
    action = (QAction *)0x0;
    if (cVar1 == '\0') {
      action = pQVar3;
    }
  }
  if (action == (QAction *)0x0) {
    pQVar4 = (QAccessibleInterface *)0x0;
  }
  else {
    (**(code **)(*(long *)&this->super_QAccessibleWidget + 0x18))(this);
    pQVar2 = (QWidget *)QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    pQVar4 = getOrCreateMenu(pQVar2,action);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return pQVar4;
}

Assistant:

QAccessibleInterface *QAccessibleMenu::childAt(int x, int y) const
{
    QAction *act = menu()->actionAt(menu()->mapFromGlobal(QPoint(x,y)));
    if (act && act->isSeparator())
        act = nullptr;
    return act ? getOrCreateMenu(menu(), act) : nullptr;
}